

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::attemptConnection(ChatWindow *this)

{
  ChatClient *this_00;
  QArrayData *local_78 [3];
  QString hostAddress;
  QArrayData *local_48 [3];
  QArrayData *local_30;
  char16_t *local_28;
  undefined8 local_20;
  
  QMetaObject::tr((char *)local_78,(char *)&staticMetaObject,0x10a8a0);
  QMetaObject::tr((char *)local_48,(char *)&staticMetaObject,0x10a8ad);
  local_30 = (QArrayData *)0x0;
  local_28 = L"127.0.0.1";
  local_20 = 9;
  QInputDialog::getText(&hostAddress,this,local_78,local_48,0,&local_30,0,0,0);
  if (local_30 != (QArrayData *)0x0) {
    LOCK();
    (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30,2,8);
    }
  }
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,8);
    }
  }
  if (local_78[0] != (QArrayData *)0x0) {
    LOCK();
    (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78[0],2,8);
    }
  }
  if (hostAddress.d.size != 0) {
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 8),0));
    this_00 = this->m_chatClient;
    QHostAddress::QHostAddress((QHostAddress *)local_78,&hostAddress);
    ChatClient::connectToServer(this_00,(QHostAddress *)local_78,0x7af);
    QHostAddress::~QHostAddress((QHostAddress *)local_78);
  }
  if (hostAddress.d.d != (Data *)0x0) {
    LOCK();
    ((hostAddress.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((hostAddress.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((hostAddress.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(hostAddress.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void ChatWindow::attemptConnection()
{
    // We ask the user for the address of the server, we use 127.0.0.1 (aka localhost) as default
    const QString hostAddress = QInputDialog::getText(
        this
        , tr("Chose Server")
        , tr("Server Address")
        , QLineEdit::Normal
        , QStringLiteral("127.0.0.1")
    );
    if (hostAddress.isEmpty())
        return; // the user pressed cancel or typed nothing
    // disable the connect button to prevent the user clicking it again
    ui->connectButton->setEnabled(false);
    // tell the client to connect to the host using the port 1967
    m_chatClient->connectToServer(QHostAddress(hostAddress), 1967);
}